

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_test.cc
# Opt level: O0

double __thiscall leveldb::BloomTest::FalsePositiveRate(BloomTest *this)

{
  bool bVar1;
  Slice local_30;
  int local_1c;
  int local_18;
  int i;
  int result;
  char buffer [4];
  BloomTest *this_local;
  
  local_18 = 0;
  _result = this;
  for (local_1c = 0; local_1c < 10000; local_1c = local_1c + 1) {
    local_30 = Key(local_1c + 1000000000,(char *)&i);
    bVar1 = Matches(this,&local_30);
    if (bVar1) {
      local_18 = local_18 + 1;
    }
  }
  return (double)local_18 / 10000.0;
}

Assistant:

double FalsePositiveRate() {
    char buffer[sizeof(int)];
    int result = 0;
    for (int i = 0; i < 10000; i++) {
      if (Matches(Key(i + 1000000000, buffer))) {
        result++;
      }
    }
    return result / 10000.0;
  }